

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

RelationsMap * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getAugmentedRelated
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *start,Relations *relations,
          bool toFirstStrict)

{
  byte bVar1;
  bool bVar2;
  Type TVar3;
  RelationEdge *pRVar4;
  ulong uVar5;
  reference pRVar6;
  Bucket *in_RSI;
  Bucket *in_RDI;
  byte in_R8B;
  pair<std::_Rb_tree_const_iterator<dg::vr::Bucket::RelationEdge>,_bool> pVar7;
  iterator it_1;
  bool shouldSkip;
  Type strictRel;
  Bucket *nestedStart;
  RelationEdge edge;
  iterator __end3;
  iterator __begin3;
  Visited *__range3;
  Visited nestedVisited;
  iterator it;
  Visited firstStrictEdges;
  RelationsMap *result;
  undefined4 in_stack_fffffffffffffd98;
  Type in_stack_fffffffffffffd9c;
  EdgeIterator *in_stack_fffffffffffffda0;
  mapped_type *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  Bucket *this_00;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  Type in_stack_fffffffffffffde4;
  RelationEdge *in_stack_fffffffffffffde8;
  RelationEdge local_1b0;
  _Self local_198;
  _Self local_190;
  undefined1 *local_188;
  _Base_ptr local_150;
  undefined1 local_148;
  undefined1 local_58 [54];
  byte local_22;
  byte local_21;
  
  local_21 = in_R8B & 1;
  local_22 = 0;
  this_00 = in_RDI;
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
         *)0x1dfc5a);
  std::
  set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::set((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
         *)0x1dfc67);
  begin_related(in_stack_fffffffffffffdd8,in_RSI,(Relations *)this_00);
  while( true ) {
    end_related((RelationsGraph<dg::vr::ValueRelations> *)this_00,in_RDI);
    bVar1 = vr::operator!=(in_stack_fffffffffffffda0,
                           (EdgeIterator *)
                           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    EdgeIterator::~EdgeIterator(in_stack_fffffffffffffda0);
    if ((bVar1 & 1) == 0) break;
    EdgeIterator::operator->((EdgeIterator *)0x1dfcf0);
    Bucket::RelationEdge::to((RelationEdge *)0x1dfcf8);
    std::reference_wrapper<dg::vr::Bucket_const>::
    reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
              ((reference_wrapper<const_dg::vr::Bucket> *)in_stack_fffffffffffffda0,
               (Bucket *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    in_stack_fffffffffffffdb0 =
         std::
         map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
         ::operator[]((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                       *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      (key_type *)in_stack_fffffffffffffdd8);
    pRVar4 = EdgeIterator::operator->((EdgeIterator *)0x1dfd2c);
    Bucket::RelationEdge::rel(pRVar4);
    Relations::set((Relations *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                   SUB41((uint)in_stack_fffffffffffffd98 >> 0x18,0));
    pRVar4 = EdgeIterator::operator->((EdgeIterator *)0x1dfd52);
    TVar3 = Bucket::RelationEdge::rel(pRVar4);
    uVar5 = dg::vr::Relations::isStrict(TVar3);
    if ((uVar5 & 1) == 0) {
      EdgeIterator::operator++(in_stack_fffffffffffffda0);
    }
    else {
      EdgeIterator::operator*((EdgeIterator *)0x1dfd74);
      pVar7 = std::
              set<dg::vr::Bucket::RelationEdge,std::less<dg::vr::Bucket::RelationEdge>,std::allocator<dg::vr::Bucket::RelationEdge>>
              ::emplace<dg::vr::Bucket::RelationEdge_const&>
                        ((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                          *)in_RDI,(RelationEdge *)CONCAT17(bVar1,in_stack_fffffffffffffdb8));
      local_150 = (_Base_ptr)pVar7.first._M_node;
      local_148 = pVar7.second;
      EdgeIterator::skipSuccessors(in_stack_fffffffffffffda0);
    }
  }
  EdgeIterator::~EdgeIterator(in_stack_fffffffffffffda0);
  std::
  set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::set((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
         *)0x1dfdc1);
  local_188 = local_58;
  local_190._M_node =
       (_Base_ptr)
       std::
       set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
       ::begin((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  local_198._M_node =
       (_Base_ptr)
       std::
       set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
       ::end((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
              *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  while (bVar2 = std::operator!=(&local_190,&local_198), bVar2) {
    pRVar6 = std::_Rb_tree_const_iterator<dg::vr::Bucket::RelationEdge>::operator*
                       ((_Rb_tree_const_iterator<dg::vr::Bucket::RelationEdge> *)0x1dfe26);
    local_1b0._from._M_data = (pRVar6->_from)._M_data;
    local_1b0._rel = pRVar6->_rel;
    local_1b0._12_4_ = *(undefined4 *)&pRVar6->field_0xc;
    local_1b0._to._M_data = (pRVar6->_to)._M_data;
    Bucket::RelationEdge::to((RelationEdge *)0x1dfe56);
    Bucket::RelationEdge::rel(&local_1b0);
    Bucket::begin(this_00,(Visited *)in_RDI,(Relations *)CONCAT17(bVar1,in_stack_fffffffffffffdb8),
                  SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x38,0),
                  SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x30,0));
    while( true ) {
      Bucket::end((Visited *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      bVar2 = vr::operator!=((EdgeIterator *)in_stack_fffffffffffffda0,
                             (EdgeIterator *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      Bucket::EdgeIterator::~EdgeIterator((EdgeIterator *)0x1dfed4);
      if (!bVar2) break;
      in_stack_fffffffffffffda0 =
           (EdgeIterator *)Bucket::EdgeIterator::operator*((EdgeIterator *)0x1dfef5);
      Bucket::EdgeIterator::operator->((EdgeIterator *)0x1dff0f);
      Bucket::RelationEdge::to((RelationEdge *)0x1dff17);
      std::reference_wrapper<dg::vr::Bucket_const>::
      reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
                ((reference_wrapper<const_dg::vr::Bucket> *)in_stack_fffffffffffffda0,
                 (Bucket *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      std::
      map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
      ::operator[]((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                    *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (key_type *)in_stack_fffffffffffffdd8);
      bVar2 = processEdge(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                          (Relations *)in_stack_fffffffffffffdd8,SUB81((ulong)in_RSI >> 0x38,0),
                          (Visited *)this_00);
      if (bVar2) {
        Bucket::EdgeIterator::operator*((EdgeIterator *)0x1dff75);
        std::
        set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
        ::erase(&in_stack_fffffffffffffda0->visited,
                (key_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        Bucket::EdgeIterator::skipSuccessors((EdgeIterator *)in_stack_fffffffffffffda0);
      }
      else {
        Bucket::EdgeIterator::operator++((EdgeIterator *)in_RSI);
      }
    }
    Bucket::EdgeIterator::~EdgeIterator((EdgeIterator *)0x1dfee6);
    std::_Rb_tree_const_iterator<dg::vr::Bucket::RelationEdge>::operator++
              ((_Rb_tree_const_iterator<dg::vr::Bucket::RelationEdge> *)in_stack_fffffffffffffda0);
  }
  local_22 = 1;
  std::
  set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::~set((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
          *)0x1dffd5);
  std::
  set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::~set((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
          *)0x1dffe2);
  if ((local_22 & 1) == 0) {
    std::
    map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
    ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
            *)0x1dfff6);
  }
  return (RelationsMap *)this_00;
}

Assistant:

RelationsMap getAugmentedRelated(const Bucket &start,
                                     const Relations &relations,
                                     bool toFirstStrict) const {
        RelationsMap result;

        Bucket::iterator::Visited firstStrictEdges;
        for (auto it = begin_related(start, relations);
             it != end_related(start);
             /*incremented in body */) {
            result[it->to()].set(it->rel());

            if (Relations::isStrict(it->rel())) {
                firstStrictEdges.emplace(*it);
                it.skipSuccessors();
            } else
                ++it;
        }

        Bucket::iterator::Visited nestedVisited;
        for (Bucket::RelationEdge edge : firstStrictEdges) {
            const Bucket &nestedStart = edge.to();
            Relations::Type strictRel = edge.rel();

            bool shouldSkip = false;
            for (auto it = nestedStart.begin(nestedVisited, relations, true,
                                             true);
                 it != nestedStart.end(nestedVisited);
                 shouldSkip ? it.skipSuccessors() : ++it) {
                shouldSkip = processEdge(*it, strictRel, result[it->to()],
                                         toFirstStrict, firstStrictEdges);
                if (shouldSkip)
                    nestedVisited.erase(*it);
            }
        }
        return result;
    }